

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

int loadJson(string *fjson,json *inj)

{
  ostream *poVar1;
  exception *e;
  istream local_228 [8];
  ifstream ifs;
  json *inj_local;
  string *fjson_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Loading JSON input file \"");
  poVar1 = std::operator<<(poVar1,(string *)fjson);
  poVar1 = std::operator<<(poVar1,"\" ...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_228,(string *)fjson,_S_in);
  nlohmann::operator>>(local_228,inj);
  std::ifstream::close();
  std::ifstream::~ifstream(local_228);
  return 0;
}

Assistant:

int loadJson(std::string& fjson, json& inj)
{
	std::cout << "Loading JSON input file \"" << fjson << "\" ..." << std::endl;
	std::ifstream ifs(fjson, std::ifstream::in);

	try
	{
		ifs >> inj;
		ifs.close();  // close to release lock on file
	}
	catch (const std::exception& e)
	{
		std::cout << "\nError:  cannot load JSON input file \"" << fjson << "\"." << std::endl;
		std::cout << e.what() << std::endl;
		return irwincolor::ERR_JSON;
	}

	return 0;
}